

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

void av1_fwd_txfm2d_64x32_c(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long in_RSI;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [2048];
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffdfa8;
  TX_SIZE in_stack_ffffffffffffdfb6;
  TX_TYPE in_stack_ffffffffffffdfb7;
  int in_stack_ffffffffffffe0ec;
  int32_t *in_stack_ffffffffffffe0f0;
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffe0f8;
  int in_stack_ffffffffffffe104;
  int32_t *in_stack_ffffffffffffe108;
  int16_t *in_stack_ffffffffffffe110;
  
  av1_get_fwd_txfm_cfg
            (in_stack_ffffffffffffdfb7,in_stack_ffffffffffffdfb6,in_stack_ffffffffffffdfa8);
  fwd_txfm2d_c(in_stack_ffffffffffffe110,in_stack_ffffffffffffe108,in_stack_ffffffffffffe104,
               in_stack_ffffffffffffe0f8,in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0ec);
  memset((void *)(in_RSI + 0x1000),0,0x1000);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x32_c(const int16_t *input, int32_t *output, int stride,
                            TX_TYPE tx_type, int bd) {
  int32_t txfm_buf[64 * 32];
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_64X32, &cfg);
  fwd_txfm2d_c(input, output, stride, &cfg, txfm_buf, bd);
  // Zero out the bottom 32x32 area.
  memset(output + 32 * 32, 0, 32 * 32 * sizeof(*output));
  // Note: no repacking needed here.
}